

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O3

idx_t duckdb_union_type_member_count(duckdb_logical_type type)

{
  idx_t iVar1;
  
  if (((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x6b)) &&
     (type[1] == (_duckdb_logical_type)0x18)) {
    iVar1 = duckdb::StructType::GetChildCount((LogicalType *)type);
    if (iVar1 != 0) {
      return iVar1 - 1;
    }
  }
  return 0;
}

Assistant:

idx_t duckdb_union_type_member_count(duckdb_logical_type type) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::UNION)) {
		return 0;
	}
	idx_t member_count = duckdb_struct_type_child_count(type);
	if (member_count != 0) {
		member_count--;
	}
	return member_count;
}